

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O1

void __thiscall CVmObjClass::save_to_file(CVmObjClass *this,CVmFile *fp)

{
  char *pcVar1;
  uint16_t tmp;
  char b [2];
  char b_1 [2];
  char b_2 [4];
  char buf [5];
  char local_28 [2];
  undefined2 local_26;
  undefined4 local_24;
  char local_1d [5];
  
  pcVar1 = (this->super_CVmObject).ext_;
  local_28[0] = '\r';
  local_28[1] = '\0';
  CVmFile::write_bytes(fp,local_28,2);
  local_26 = *(undefined2 *)pcVar1;
  CVmFile::write_bytes(fp,(char *)&local_26,2);
  local_24 = *(undefined4 *)(pcVar1 + 4);
  CVmFile::write_bytes(fp,(char *)&local_24,4);
  vmb_put_dh(local_1d,(vm_val_t *)(pcVar1 + 8));
  CVmFile::write_bytes(fp,local_1d,5);
  return;
}

Assistant:

void CVmObjClass::save_to_file(VMG_ class CVmFile *fp)
{
    /* write our data: data size, meta table index, mod ID, class state */
    vm_intcls_ext *ext = get_ext();
    fp->write_uint2(2 + 2 + 4 + VMB_DATAHOLDER);
    fp->write_uint2(ext->meta_idx);
    fp->write_uint4(ext->mod_obj);

    char buf[VMB_DATAHOLDER];
    vmb_put_dh(buf, &ext->class_state);
    fp->write_bytes(buf, VMB_DATAHOLDER);
}